

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O3

void anon_unknown.dwarf_9a77::update_manifest(Manifest *manifest,Target *target,xml_node node)

{
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *this;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *this_00;
  Manifest *this_01;
  bool bVar1;
  int iVar2;
  xml_node *pxVar3;
  char_t *pcVar4;
  size_t sVar5;
  pair<std::_Rb_tree_iterator<wire::string>,_std::_Rb_tree_iterator<wire::string>_> pVar6;
  xml_node child;
  xml_node rn;
  xml_node local_130;
  xml_attribute local_128;
  xml_node local_120;
  xml_named_node_iterator local_118;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  xml_object_range<pugi::xml_named_node_iterator> local_e8;
  Manifest *local_c0;
  xml_named_node_iterator local_b8;
  xml_named_node_iterator local_a8;
  Target *local_98;
  xml_node local_90;
  xml_named_node_iterator local_88;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *local_78;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *local_70;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *local_68;
  xml_node local_60;
  xml_object_range<pugi::xml_named_node_iterator> local_58;
  
  local_c0 = manifest;
  local_98 = target;
  local_60._root = node._root;
  pugi::xml_node::children(&local_58,&local_60,"require");
  local_a8._node._root = local_58._begin._node._root;
  local_a8._name = local_58._begin._name;
  local_88._node._root = local_58._end._node._root;
  local_88._name = local_58._end._name;
  bVar1 = pugi::xml_named_node_iterator::operator!=(&local_a8,&local_88);
  if (bVar1) {
    local_68 = &local_c0->types;
    local_70 = &local_c0->enums;
    local_78 = &local_c0->commands;
    do {
      pxVar3 = pugi::xml_named_node_iterator::operator*(&local_a8);
      local_120._root = pxVar3->_root;
      pugi::xml_node::children(&local_e8,&local_120,"type");
      local_b8._node._root = local_e8._begin._node._root;
      local_b8._name = local_e8._begin._name;
      local_118._node._root = local_e8._end._node._root;
      local_118._name = local_e8._end._name;
      while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b8,&local_118), bVar1) {
        pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b8);
        local_130._root = pxVar3->_root;
        local_128 = pugi::xml_node::attribute(&local_130,"name");
        pcVar4 = pugi::xml_attribute::value(&local_128);
        if (pcVar4 == (char_t *)0x0) {
          pcVar4 = "";
        }
        local_108[0] = local_f8;
        sVar5 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,pcVar4,pcVar4 + sVar5);
        std::
        _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
        ::_M_insert_unique<wire::string>(&local_68->_M_t,(string *)local_108);
        if (local_108[0] != local_f8) {
          operator_delete(local_108[0]);
        }
        pugi::xml_named_node_iterator::operator++(&local_b8);
      }
      pugi::xml_node::children(&local_e8,&local_120,"enum");
      local_b8._node._root = local_e8._begin._node._root;
      local_b8._name = local_e8._begin._name;
      local_118._node._root = local_e8._end._node._root;
      local_118._name = local_e8._end._name;
      while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b8,&local_118), bVar1) {
        pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b8);
        local_130._root = pxVar3->_root;
        local_128 = pugi::xml_node::attribute(&local_130,"name");
        pcVar4 = pugi::xml_attribute::value(&local_128);
        if (pcVar4 == (char_t *)0x0) {
          pcVar4 = "";
        }
        local_108[0] = local_f8;
        sVar5 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,pcVar4,pcVar4 + sVar5);
        std::
        _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
        ::_M_insert_unique<wire::string>(&local_70->_M_t,(string *)local_108);
        if (local_108[0] != local_f8) {
          operator_delete(local_108[0]);
        }
        pugi::xml_named_node_iterator::operator++(&local_b8);
      }
      pugi::xml_node::children(&local_e8,&local_120,"command");
      local_b8._node._root = local_e8._begin._node._root;
      local_b8._name = local_e8._begin._name;
      local_118._node._root = local_e8._end._node._root;
      local_118._name = local_e8._end._name;
      while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b8,&local_118), bVar1) {
        pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b8);
        local_130._root = pxVar3->_root;
        local_128 = pugi::xml_node::attribute(&local_130,"name");
        pcVar4 = pugi::xml_attribute::value(&local_128);
        if (pcVar4 == (char_t *)0x0) {
          pcVar4 = "";
        }
        local_108[0] = local_f8;
        sVar5 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,pcVar4,pcVar4 + sVar5);
        std::
        _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
        ::_M_insert_unique<wire::string>(&local_78->_M_t,(string *)local_108);
        if (local_108[0] != local_f8) {
          operator_delete(local_108[0]);
        }
        pugi::xml_named_node_iterator::operator++(&local_b8);
      }
      pugi::xml_named_node_iterator::operator++(&local_a8);
      bVar1 = pugi::xml_named_node_iterator::operator!=(&local_a8,&local_88);
    } while (bVar1);
  }
  pugi::xml_node::children(&local_58,&local_60,"remove");
  local_a8._node._root = local_58._begin._node._root;
  local_a8._name = local_58._begin._name;
  local_88._node._root = local_58._end._node._root;
  local_88._name = local_58._end._name;
  bVar1 = pugi::xml_named_node_iterator::operator!=(&local_a8,&local_88);
  if (bVar1) {
    local_98 = (Target *)&local_98->profile;
    this = &local_c0->types;
    this_00 = &local_c0->enums;
    local_c0 = (Manifest *)&local_c0->commands;
    do {
      pxVar3 = pugi::xml_named_node_iterator::operator*(&local_a8);
      local_90._root = pxVar3->_root;
      local_e8._begin._node._root =
           (xml_node_struct *)pugi::xml_node::attribute(&local_90,"profile");
      pugi::xml_attribute::value((xml_attribute *)&local_e8);
      iVar2 = std::__cxx11::string::compare((char *)local_98);
      if (iVar2 == 0) {
        local_120._root = local_90._root;
        pugi::xml_node::children(&local_e8,&local_120,"type");
        local_b8._node._root = local_e8._begin._node._root;
        local_b8._name = local_e8._begin._name;
        local_118._node._root = local_e8._end._node._root;
        local_118._name = local_e8._end._name;
        while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b8,&local_118), bVar1) {
          pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b8);
          local_130._root = pxVar3->_root;
          local_128 = pugi::xml_node::attribute(&local_130,"name");
          pcVar4 = pugi::xml_attribute::value(&local_128);
          if (pcVar4 == (char_t *)0x0) {
            pcVar4 = "";
          }
          local_108[0] = local_f8;
          sVar5 = strlen(pcVar4);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,pcVar4,pcVar4 + sVar5)
          ;
          pVar6 = std::
                  _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                  ::equal_range(&this->_M_t,(key_type *)local_108);
          std::
          _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
          ::_M_erase_aux(&this->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node)
          ;
          if (local_108[0] != local_f8) {
            operator_delete(local_108[0]);
          }
          pugi::xml_named_node_iterator::operator++(&local_b8);
        }
        pugi::xml_node::children(&local_e8,&local_120,"enum");
        local_b8._node._root = local_e8._begin._node._root;
        local_b8._name = local_e8._begin._name;
        local_118._node._root = local_e8._end._node._root;
        local_118._name = local_e8._end._name;
        while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b8,&local_118), bVar1) {
          pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b8);
          local_130._root = pxVar3->_root;
          local_128 = pugi::xml_node::attribute(&local_130,"name");
          pcVar4 = pugi::xml_attribute::value(&local_128);
          if (pcVar4 == (char_t *)0x0) {
            pcVar4 = "";
          }
          local_108[0] = local_f8;
          sVar5 = strlen(pcVar4);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,pcVar4,pcVar4 + sVar5)
          ;
          pVar6 = std::
                  _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                  ::equal_range(&this_00->_M_t,(key_type *)local_108);
          std::
          _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,
                         (_Base_ptr)pVar6.second._M_node);
          if (local_108[0] != local_f8) {
            operator_delete(local_108[0]);
          }
          pugi::xml_named_node_iterator::operator++(&local_b8);
        }
        pugi::xml_node::children(&local_e8,&local_120,"command");
        local_b8._node._root = local_e8._begin._node._root;
        local_b8._name = local_e8._begin._name;
        local_118._node._root = local_e8._end._node._root;
        local_118._name = local_e8._end._name;
        while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b8,&local_118), bVar1) {
          pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b8);
          local_130._root = pxVar3->_root;
          local_128 = pugi::xml_node::attribute(&local_130,"name");
          pcVar4 = pugi::xml_attribute::value(&local_128);
          if (pcVar4 == (char_t *)0x0) {
            pcVar4 = "";
          }
          local_108[0] = local_f8;
          sVar5 = strlen(pcVar4);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,pcVar4,pcVar4 + sVar5)
          ;
          this_01 = local_c0;
          pVar6 = std::
                  _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                  ::equal_range((_Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                                 *)local_c0,(key_type *)local_108);
          std::
          _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
          ::_M_erase_aux((_Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                          *)this_01,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
          if (local_108[0] != local_f8) {
            operator_delete(local_108[0]);
          }
          pugi::xml_named_node_iterator::operator++(&local_b8);
        }
      }
      pugi::xml_named_node_iterator::operator++(&local_a8);
      bVar1 = pugi::xml_named_node_iterator::operator!=(&local_a8,&local_88);
    } while (bVar1);
  }
  return;
}

Assistant:

void update_manifest(Manifest& manifest,
                     const Target& target,
                     const pugi::xml_node node)
{
  for (const pugi::xml_node rn : node.children("require"))
    add_to_manifest(manifest, rn);

  // Apply <remove> tags for the selected profile
  for (const pugi::xml_node rn : node.children("remove"))
  {
    if (rn.attribute("profile").value() == target.profile)
      remove_from_manifest(manifest, rn);
  }
}